

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O3

int Curl_wait_ms(timediff_t timeout_ms)

{
  int iVar1;
  int *piVar2;
  timediff_t tVar3;
  
  if (timeout_ms == 0) {
    return 0;
  }
  if (timeout_ms < 0) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
  }
  else {
    tVar3 = 0x7fffffff;
    if ((ulong)timeout_ms < 0x7fffffff) {
      tVar3 = timeout_ms;
    }
    iVar1 = poll((pollfd *)0x0,0,(int)tVar3);
    if (iVar1 == 0) {
      return 0;
    }
    if ((iVar1 == -1) && (piVar2 = __errno_location(), *piVar2 == 4)) {
      return 0;
    }
  }
  return -1;
}

Assistant:

int Curl_wait_ms(timediff_t timeout_ms)
{
  int r = 0;

  if(!timeout_ms)
    return 0;
  if(timeout_ms < 0) {
    SET_SOCKERRNO(EINVAL);
    return -1;
  }
#if defined(MSDOS)
  delay(timeout_ms);
#elif defined(_WIN32)
  /* prevent overflow, timeout_ms is typecast to ULONG/DWORD. */
#if TIMEDIFF_T_MAX >= ULONG_MAX
  if(timeout_ms >= ULONG_MAX)
    timeout_ms = ULONG_MAX-1;
    /* don't use ULONG_MAX, because that is equal to INFINITE */
#endif
  Sleep((ULONG)timeout_ms);
#else
#if defined(HAVE_POLL_FINE)
  /* prevent overflow, timeout_ms is typecast to int. */
#if TIMEDIFF_T_MAX > INT_MAX
  if(timeout_ms > INT_MAX)
    timeout_ms = INT_MAX;
#endif
  r = poll(NULL, 0, (int)timeout_ms);
#else
  {
    struct timeval pending_tv;
    r = select(0, NULL, NULL, NULL, curlx_mstotv(&pending_tv, timeout_ms));
  }
#endif /* HAVE_POLL_FINE */
#endif /* USE_WINSOCK */
  if(r) {
    if((r == -1) && (SOCKERRNO == EINTR))
      /* make EINTR from select or poll not a "lethal" error */
      r = 0;
    else
      r = -1;
  }
  return r;
}